

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

float ScaleMaxSamples_C(float *src,float *dst,float scale,int width)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  
  lVar3 = 0;
  if (width < 1) {
    width = 0;
  }
  fVar4 = 0.0;
  for (; width != (int)lVar3; lVar3 = lVar3 + 1) {
    fVar1 = src[lVar3];
    fVar2 = fVar1;
    if (fVar1 <= fVar4) {
      fVar2 = fVar4;
    }
    fVar4 = fVar2;
    dst[lVar3] = fVar1 * scale;
  }
  return fVar4;
}

Assistant:

float ScaleMaxSamples_C(const float* src, float* dst, float scale, int width) {
  float fmax = 0.f;
  int i;
  for (i = 0; i < width; ++i) {
    float v = *src++;
    float vs = v * scale;
    fmax = (v > fmax) ? v : fmax;
    *dst++ = vs;
  }
  return fmax;
}